

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void move_tokens(VARR_token_t *to,VARR_token_t *from)

{
  token_t ptVar1;
  pre_ctx *ppVar2;
  VARR_char_ptr_t *pVVar3;
  stream_t psVar4;
  int iVar5;
  ulong uVar6;
  token_t *pptVar7;
  undefined4 extraout_var;
  pre_ctx *extraout_RAX;
  pre_ctx *f;
  token_t *in_RCX;
  char *extraout_RDX;
  c2m_ctx_t unaff_RBX;
  size_t sVar8;
  VARR_token_t *__s1;
  c2m_ctx_t __ptr;
  undefined8 in_R8;
  size_t sVar9;
  VARR_token_t *unaff_R14;
  char *unaff_R15;
  
  __s1 = from;
  __ptr = (c2m_ctx_t)to;
  if ((to == (VARR_token_t *)0x0) || (unaff_R14 = to, to->varr == (token_t *)0x0)) {
LAB_00194b76:
    move_tokens_cold_5();
  }
  else {
    to->els_num = 0;
    unaff_RBX = (c2m_ctx_t)from;
    if (from != (VARR_token_t *)0x0) {
      unaff_R15 = (char *)0x0;
      do {
        if ((char *)from->els_num <= unaff_R15) goto LAB_00194b54;
        if (from->varr == (token_t *)0x0) {
LAB_00194b71:
          move_tokens_cold_3();
          goto LAB_00194b76;
        }
        __ptr = (c2m_ctx_t)to->varr;
        if (__ptr == (c2m_ctx_t)0x0) {
          move_tokens_cold_2();
          goto LAB_00194b71;
        }
        ptVar1 = from->varr[(long)unaff_R15];
        uVar6 = to->els_num + 1;
        if (to->size < uVar6) {
          sVar9 = (uVar6 >> 1) + uVar6;
          __s1 = (VARR_token_t *)(sVar9 * 8);
          pptVar7 = (token_t *)realloc(__ptr,(size_t)__s1);
          to->varr = pptVar7;
          to->size = sVar9;
        }
        sVar9 = to->els_num;
        in_RCX = to->varr;
        unaff_R15 = unaff_R15 + 1;
        to->els_num = sVar9 + 1;
        in_RCX[sVar9] = ptVar1;
      } while (from != (VARR_token_t *)0x0);
    }
    move_tokens_cold_4();
LAB_00194b54:
    if (from->varr != (token_t *)0x0) {
      from->els_num = 0;
      return;
    }
  }
  move_tokens_cold_1();
  ppVar2 = __ptr->pre_ctx;
  pVVar3 = ppVar2->once_include_files;
  if (pVVar3 != (VARR_char_ptr_t *)0x0) {
    sVar9 = pVVar3->els_num;
    sVar8 = 0;
    f = ppVar2;
    do {
      unaff_RBX = __ptr;
      unaff_R14 = __s1;
      unaff_R15 = extraout_RDX;
      if (sVar9 == sVar8) goto LAB_00194bee;
      if (pVVar3->varr == (char_ptr_t *)0x0) {
        add_include_stream_cold_1();
        goto LAB_00194c7c;
      }
      iVar5 = strcmp((char *)__s1,pVVar3->varr[sVar8]);
      f = (pre_ctx *)CONCAT44(extraout_var,iVar5);
      if (iVar5 == 0) {
        return;
      }
      sVar8 = sVar8 + 1;
    } while (pVVar3 != (VARR_char_ptr_t *)0x0);
  }
  add_include_stream_cold_3();
  f = extraout_RAX;
LAB_00194bee:
  if (unaff_R14 != (VARR_token_t *)0x0) {
    if ((unaff_R15 != (char *)0x0) ||
       (f = (pre_ctx *)fopen((char *)unaff_R14,"rb"), f != (pre_ctx *)0x0)) {
      if (unaff_R15 == (char *)0x0) {
        add_stream(unaff_RBX,(FILE *)f,(char *)unaff_R14,(_func_int_c2m_ctx_t *)0x0);
      }
      else {
        add_stream(unaff_RBX,(FILE *)0x0,(char *)unaff_R14,str_getc);
        psVar4 = unaff_RBX->cs;
        psVar4->curr = unaff_R15;
        psVar4->start = unaff_R15;
      }
      if (ppVar2->ifs != (VARR_ifstate_t *)0x0) {
        unaff_RBX->cs->ifs_length_at_stream_start = (int)ppVar2->ifs->els_num;
        return;
      }
      add_include_stream_cold_2();
    }
    if (unaff_RBX->options->message_file != (FILE *)0x0) {
      error(unaff_RBX,0x1c34f7,(char *)in_RCX,in_R8,unaff_R14);
    }
    longjmp((__jmp_buf_tag *)unaff_RBX->env,1);
  }
LAB_00194c7c:
  __assert_fail("fname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
}

Assistant:

static void move_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  VARR_TRUNC (token_t, to, 0);
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    VARR_PUSH (token_t, to, VARR_GET (token_t, from, i));
  VARR_TRUNC (token_t, from, 0);
}